

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemView::setSelectionModel(QAbstractItemView *this,QItemSelectionModel *selectionModel)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 *puVar6;
  QObject *pQVar7;
  void **ppvVar8;
  QObject *pQVar9;
  long in_FS_OFFSET;
  void **local_b8;
  Connection local_b0;
  QObject local_a8 [8];
  QArrayDataPointer<QItemSelectionRange> local_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayDataPointer<QItemSelectionRange> local_68;
  QSlotObjectBase local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar3 = QItemSelectionModel::model();
  if (lVar3 == *(long *)(lVar1 + 0x2f8)) {
    local_68.d = (Data *)0x0;
    local_68.ptr = (QItemSelectionRange *)0x0;
    local_68.size = 0;
    local_88 = 0xffffffffffffffff;
    uStack_80 = 0;
    local_78 = 0;
    if (((*(long *)(lVar1 + 800) != 0) && (*(int *)(*(long *)(lVar1 + 800) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x328) != 0)) {
      lVar3 = QItemSelectionModel::model();
      lVar4 = QItemSelectionModel::model();
      if (lVar3 == lVar4) {
        QItemSelectionModel::selection();
        QArrayDataPointer<QItemSelectionRange>::operator=(&local_68,&local_a0);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_a0);
        QItemSelectionModel::currentIndex();
      }
      if ((*(long *)(lVar1 + 800) == 0) || (*(int *)(*(long *)(lVar1 + 800) + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = *(QObject **)(lVar1 + 0x328);
      }
      local_a0.d = (Data *)QItemSelectionModel::selectionChanged;
      pQVar9 = (QObject *)0x0;
      local_a0.ptr = (QItemSelectionRange *)0x0;
      local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x249;
      local_48._4_4_ = 0;
      local_48.m_impl = (ImplFn)0x0;
      QObject::disconnectImpl
                (pQVar7,&local_a0.d,(QObject *)this,(void **)&local_48,
                 (QMetaObject *)&QItemSelectionModel::staticMetaObject);
      if (*(long *)(lVar1 + 800) != 0) {
        if (*(int *)(*(long *)(lVar1 + 800) + 4) == 0) {
          pQVar9 = (QObject *)0x0;
        }
        else {
          pQVar9 = *(QObject **)(lVar1 + 0x328);
        }
      }
      local_a0.d = (Data *)QItemSelectionModel::currentChanged;
      local_a0.ptr = (QItemSelectionRange *)0x0;
      local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x251;
      local_48._4_4_ = 0;
      local_48.m_impl = (ImplFn)0x0;
      QObject::disconnectImpl
                (pQVar9,&local_a0.d,(QObject *)this,(void **)&local_48,
                 (QMetaObject *)&QItemSelectionModel::staticMetaObject);
    }
    uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)selectionModel);
    piVar2 = *(int **)(lVar1 + 800);
    *(undefined8 *)(lVar1 + 800) = uVar5;
    *(QItemSelectionModel **)(lVar1 + 0x328) = selectionModel;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
    lVar3 = *(long *)(lVar1 + 800);
    if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) && (*(long *)(lVar1 + 0x328) != 0)) {
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        local_b8 = (void **)0x0;
      }
      else {
        local_b8 = *(void ***)(lVar1 + 0x328);
      }
      local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x249;
      local_48._4_4_ = 0;
      ppvVar8 = (void **)0x0;
      local_48.m_impl = (ImplFn)0x0;
      local_a0.d = (Data *)QItemSelectionModel::selectionChanged;
      local_a0.ptr = (QItemSelectionRange *)0x0;
      puVar6 = (undefined4 *)operator_new(0x20);
      *puVar6 = 1;
      *(code **)(puVar6 + 2) =
           QtPrivate::
           QCallableObject<void_(QAbstractItemView::*)(const_QItemSelection_&,_const_QItemSelection_&),_QtPrivate::List<const_QItemSelection_&,_const_QItemSelection_&>,_void>
           ::impl;
      *(undefined8 *)(puVar6 + 4) = 0x249;
      *(undefined8 *)(puVar6 + 6) = 0;
      QObject::connectImpl
                (local_a8,local_b8,(QObject *)&local_a0,(void **)this,&local_48,
                 (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_a8);
      if (*(long *)(lVar1 + 800) != 0) {
        if (*(int *)(*(long *)(lVar1 + 800) + 4) == 0) {
          ppvVar8 = (void **)0x0;
        }
        else {
          ppvVar8 = *(void ***)(lVar1 + 0x328);
        }
      }
      local_48.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x251;
      local_48._4_4_ = 0;
      local_48.m_impl = (ImplFn)0x0;
      local_a0.d = (Data *)QItemSelectionModel::currentChanged;
      local_a0.ptr = (QItemSelectionRange *)0x0;
      puVar6 = (undefined4 *)operator_new(0x20);
      *puVar6 = 1;
      *(code **)(puVar6 + 2) =
           QtPrivate::
           QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
           ::impl;
      *(undefined8 *)(puVar6 + 4) = 0x251;
      *(undefined8 *)(puVar6 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_b0,ppvVar8,(QObject *)&local_a0,(void **)this,&local_48,
                 (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_b0);
      QItemSelectionModel::selection();
      (**(code **)(*(long *)this + 0x248))(this,&local_a0,&local_68);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_a0);
      QItemSelectionModel::currentIndex();
      (**(code **)(*(long *)this + 0x250))(this,&local_a0,&local_88);
    }
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_68);
  }
  else {
    setSelectionModel();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    // ### if the given model is null, we should use the original selection model
    Q_ASSERT(selectionModel);
    Q_D(QAbstractItemView);

    if (Q_UNLIKELY(selectionModel->model() != d->model)) {
        qWarning("QAbstractItemView::setSelectionModel() failed: "
                 "Trying to set a selection model, which works on "
                 "a different model than the view.");
        return;
    }

    QItemSelection oldSelection;
    QModelIndex oldCurrentIndex;

    if (d->selectionModel) {
        if (d->selectionModel->model() == selectionModel->model()) {
            oldSelection = d->selectionModel->selection();
            oldCurrentIndex = d->selectionModel->currentIndex();
        }
        disconnect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                   this, &QAbstractItemView::selectionChanged);
        disconnect(d->selectionModel, &QItemSelectionModel::currentChanged,
                   this, &QAbstractItemView::currentChanged);
    }

    d->selectionModel = selectionModel;

    if (d->selectionModel) {
        connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                this, &QAbstractItemView::selectionChanged);
        connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                this, &QAbstractItemView::currentChanged);

        selectionChanged(d->selectionModel->selection(), oldSelection);
        currentChanged(d->selectionModel->currentIndex(), oldCurrentIndex);
    }
}